

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O2

void __thiscall Conversion::setVocab(Conversion *this,string *vocab)

{
  mapped_type *pmVar1;
  int i;
  ulong uVar2;
  long lVar3;
  
  std::__cxx11::string::_M_assign((string *)this);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < vocab->_M_string_length; uVar2 = uVar2 + 1) {
    pmVar1 = std::
             map<char,_long_long,_std::less<char>,_std::allocator<std::pair<const_char,_long_long>_>_>
             ::operator[](&this->charToIndex,(vocab->_M_dataplus)._M_p + uVar2);
    *pmVar1 = lVar3 >> 0x38;
    lVar3 = lVar3 + 0x100000000000000;
  }
  return;
}

Assistant:

void Conversion::setVocab(string vocab) {
    this->indexToChar = vocab;
    for (int i = 0; i < vocab.size(); i++) {
        charToIndex[vocab[i]] = static_cast<char>(i);
    }
}